

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.hpp
# Opt level: O2

LoopItem * __thiscall
Qentem::
Array<Qentem::TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::LoopItem>::
allocate(Array<Qentem::TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::LoopItem>
         *this)

{
  LoopItem *pointer;
  
  pointer = (LoopItem *)operator_new((ulong)this->capacity_ * 0x18);
  MemoryRecord::AddAllocation(pointer);
  this->storage_ = pointer;
  return pointer;
}

Assistant:

Type_T *allocate() {
        Type_T *new_storage = Memory::Allocate<Type_T>(Capacity());
        setStorage(new_storage);
        return new_storage;
    }